

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::CommitParser::ProcessLine(CommitParser *this)

{
  ulong uVar1;
  CommitParser *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    switch(this->Section) {
    case SectionHeader:
      DoHeaderLine(this);
      break;
    case SectionBody:
      DoBodyLine(this);
      break;
    case SectionDiff:
      DiffParser::ProcessLine(&this->super_DiffParser);
      break;
    case SectionCount:
    }
  }
  else {
    if ((this->Section == SectionBody) &&
       ((this->super_DiffParser).super_LineParser.LineEnd == '\0')) {
      NextSection(this);
    }
    NextSection(this);
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->Line.empty()) {
      if (this->Section == SectionBody && this->LineEnd == '\0') {
        // Skip SectionDiff
        this->NextSection();
      }
      this->NextSection();
    } else {
      switch (this->Section) {
        case SectionHeader:
          this->DoHeaderLine();
          break;
        case SectionBody:
          this->DoBodyLine();
          break;
        case SectionDiff:
          this->DiffParser::ProcessLine();
          break;
        case SectionCount:
          break; // never happens
      }
    }
    return true;
  }